

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O0

bool s2shapeutil::FindSelfIntersection(S2ShapeIndex *index,S2Error *error)

{
  S2Error *index_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  anon_class_16_2_ba593470 local_88;
  EdgePairVisitor local_78;
  S2Shape *local_58;
  S2Shape *shape;
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Error *local_20;
  S2Error *error_local;
  S2ShapeIndex *index_local;
  
  local_20 = error;
  error_local = (S2Error *)index;
  iVar2 = (*index->_vptr_S2ShapeIndex[2])();
  if (iVar2 == 0) {
    index_local._7_1_ = 0;
  }
  else {
    iVar2 = (**(code **)(*(long *)error_local + 0x10))();
    local_39 = 0;
    if (iVar2 != 1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_visit_crossing_edge_pairs.cc"
                 ,0x1ab,kFatal,(ostream *)&std::cerr);
      local_39 = 1;
      poVar3 = S2LogMessage::stream(&local_38);
      poVar3 = std::operator<<(poVar3,"Check failed: (1) == (index.num_shape_ids()) ");
      S2LogMessageVoidify::operator&(&local_21,poVar3);
    }
    if ((local_39 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
    }
    local_88.shape = (S2Shape *)(**(code **)(*(long *)error_local + 0x18))();
    index_00 = error_local;
    local_88.error = &local_20;
    local_58 = local_88.shape;
    std::function<bool(s2shapeutil::ShapeEdge_const&,s2shapeutil::ShapeEdge_const&,bool)>::
    function<s2shapeutil::FindSelfIntersection(S2ShapeIndex_const&,S2Error*)::__0,void>
              ((function<bool(s2shapeutil::ShapeEdge_const&,s2shapeutil::ShapeEdge_const&,bool)> *)
               &local_78,&local_88);
    bVar1 = VisitCrossings((S2ShapeIndex *)index_00,ALL,false,&local_78);
    index_local._7_1_ = (bVar1 ^ 0xffU) & 1;
    std::function<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool)>::
    ~function(&local_78);
  }
  return (bool)(index_local._7_1_ & 1);
}

Assistant:

bool FindSelfIntersection(const S2ShapeIndex& index, S2Error* error) {
  if (index.num_shape_ids() == 0) return false;
  S2_DCHECK_EQ(1, index.num_shape_ids());
  const S2Shape& shape = *index.shape(0);

  // Visit all crossing pairs except possibly for ones of the form (AB, BC),
  // since such pairs are very common and FindCrossingError() only needs pairs
  // of the form (AB, AC).
  return !VisitCrossings(
      index, CrossingType::ALL, false /*need_adjacent*/,
      [&](const ShapeEdge& a, const ShapeEdge& b, bool is_interior) {
        return !FindCrossingError(shape, a, b, is_interior, error);
      });
}